

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_merge_pass.cpp
# Opt level: O0

bool __thiscall spvtools::opt::BlockMergePass::MergeBlocks(BlockMergePass *this,Function *func)

{
  bool bVar1;
  IRContext *pIVar2;
  reference pvVar3;
  UnderlyingIterator in_R8;
  iterator bi_00;
  iterator local_40;
  undefined1 local_30 [8];
  iterator bi;
  bool modified;
  Function *func_local;
  BlockMergePass *this_local;
  
  bi.iterator_._M_current._7_1_ = 0;
  _local_30 = opt::Function::begin(func);
  do {
    while( true ) {
      local_40 = opt::Function::end(func);
      bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                        ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_30,&local_40)
      ;
      if (!bVar1) {
        return (bool)(bi.iterator_._M_current._7_1_ & 1);
      }
      pIVar2 = Pass::context(&this->super_Pass);
      pvVar3 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                         ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_30);
      bVar1 = IRContext::IsReachable(pIVar2,pvVar3);
      if (bVar1) break;
LAB_00919ef7:
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_30);
    }
    pIVar2 = Pass::context(&this->super_Pass);
    pvVar3 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                       ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_30);
    bVar1 = blockmergeutil::CanMergeWithSuccessor(pIVar2,pvVar3);
    if (!bVar1) goto LAB_00919ef7;
    pIVar2 = Pass::context(&this->super_Pass);
    bi_00.iterator_._M_current = in_R8._M_current;
    bi_00.container_ = bi.container_;
    blockmergeutil::MergeWithSuccessor
              ((blockmergeutil *)pIVar2,(IRContext *)func,(Function *)local_30,bi_00);
    bi.iterator_._M_current._7_1_ = 1;
  } while( true );
}

Assistant:

bool BlockMergePass::MergeBlocks(Function* func) {
  bool modified = false;
  for (auto bi = func->begin(); bi != func->end();) {
    // Don't bother trying to merge unreachable blocks.
    if (context()->IsReachable(*bi) &&
        blockmergeutil::CanMergeWithSuccessor(context(), &*bi)) {
      blockmergeutil::MergeWithSuccessor(context(), func, bi);
      // Reprocess block.
      modified = true;
    } else {
      ++bi;
    }
  }
  return modified;
}